

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *this)

{
  QRegularExpressionMatchPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QRegularExpressionMatchPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QRegularExpressionMatchPrivate *)0x0) {
        pDVar2 = (pQVar1->capturedOffsets).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pQVar1->capturedOffsets).d.d)->super_QArrayData,8,0x10);
          }
        }
        pDVar3 = (pQVar1->subjectStorage).d.d;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pQVar1->subjectStorage).d.d)->super_QArrayData,2,0x10);
          }
        }
        QExplicitlySharedDataPointer<QRegularExpressionPrivate>::~QExplicitlySharedDataPointer
                  (&(pQVar1->regularExpression).d);
      }
      operator_delete(pQVar1,0x60);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }